

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse::CodeGeneratorResponse
          (CodeGeneratorResponse *this,CodeGeneratorResponse *from)

{
  bool bVar1;
  string *psVar2;
  Arena *pAVar3;
  CodeGeneratorResponse *from_local;
  CodeGeneratorResponse *this_local;
  
  Message::Message(&this->super_Message);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__CodeGeneratorResponse_008e6a38;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  internal::CachedSize::CachedSize(&this->_cached_size_);
  RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File>::RepeatedPtrField
            (&this->file_,&from->file_);
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_,
             &(from->super_Message).super_MessageLite._internal_metadata_);
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault(&this->error_,psVar2);
  bVar1 = _internal_has_error(from);
  if (bVar1) {
    psVar2 = _internal_error_abi_cxx11_(from);
    pAVar3 = MessageLite::GetArenaForAllocation((MessageLite *)this);
    internal::ArenaStringPtr::Set(&this->error_,psVar2,pAVar3);
  }
  this->supported_features_ = from->supported_features_;
  return;
}

Assistant:

CodeGeneratorResponse::CodeGeneratorResponse(const CodeGeneratorResponse& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _has_bits_(from._has_bits_),
      file_(from.file_) {
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
  error_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    error_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (from._internal_has_error()) {
    error_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_error(), 
      GetArenaForAllocation());
  }
  supported_features_ = from.supported_features_;
  // @@protoc_insertion_point(copy_constructor:google.protobuf.compiler.CodeGeneratorResponse)
}